

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall
tournser::tournser(tournser *this,delta_complex_t *_complex,char *_outname,size_t _max_entries,
                  bool _python)

{
  index_t iVar1;
  value_type_conflict1 local_248;
  ofstream local_240 [535];
  byte local_29;
  size_t sStack_28;
  bool _python_local;
  size_t _max_entries_local;
  char *_outname_local;
  delta_complex_t *_complex_local;
  tournser *this_local;
  
  this->complex = _complex;
  local_29 = _python;
  sStack_28 = _max_entries;
  _max_entries_local = (size_t)_outname;
  _outname_local = (char *)_complex;
  _complex_local = (delta_complex_t *)this;
  std::ofstream::ofstream(&this->outfile);
  iVar1 = delta_complex_t::number_of_cells(this->complex,0);
  this->n = iVar1;
  iVar1 = delta_complex_t::top_dimension(this->complex);
  this->dim_max = iVar1;
  std::vector<filtration_entry_t,_std::allocator<filtration_entry_t>_>::vector
            (&this->coface_entries);
  this->max_entries = sStack_28;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->skipped_entries);
  this->python = (bool)(local_29 & 1);
  std::
  vector<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>,_std::allocator<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
  ::vector(&this->finite_pairs);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::vector(&this->infinite_pairs);
  if ((this->python & 1U) == 0) {
    std::ofstream::ofstream(local_240,(char *)_max_entries_local,_S_out);
    std::ofstream::operator=(&this->outfile,local_240);
    std::ofstream::~ofstream(local_240);
  }
  local_248 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::assign
            (&this->skipped_entries,this->dim_max + 1,&local_248);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::resize(&this->infinite_pairs,this->dim_max + 1);
  std::
  vector<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>,_std::allocator<std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>_>
  ::resize(&this->finite_pairs,this->dim_max + 1);
  return;
}

Assistant:

tournser(	delta_complex_t* _complex, char* _outname, size_t _max_entries, bool _python)
	    : complex(_complex), n(complex->number_of_cells(0)),
	      dim_max(complex->top_dimension()),
		  max_entries(_max_entries),
		  python(_python){
				if(!python) {outfile = std::ofstream(_outname);}
				skipped_entries.assign(dim_max+1,0);
				infinite_pairs.resize(dim_max+1);
				finite_pairs.resize(dim_max+1);
			  }